

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float **ppfVar7;
  double *pdVar8;
  bool bVar9;
  uint uVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int k;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  BeagleCPUImpl<float,_1,_0> *pBVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [64];
  undefined8 in_XMM3_Qb;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_b9;
  BeagleCPUImpl<float,_1,_0> *local_b8;
  ulong local_b0;
  int *local_a8;
  long local_a0;
  ulong local_98;
  int *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  long local_70;
  ulong local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar17 = (ulong)(uint)count;
  local_a8 = scaleBufferIndices;
  local_90 = bufferIndices;
  local_80 = categoryWeightsIndices;
  local_78 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  local_b8 = this;
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(long)this->kPatternCount,&local_b9);
  pBVar20 = local_b8;
  local_98 = uVar17;
  if (0 < count) {
    uVar16 = 0;
    local_68 = (ulong)(count - 1);
    uVar12 = (ulong)(uint)local_b8->kPatternCount;
    local_88 = uVar17;
    do {
      local_70 = (long)local_90[uVar16];
      pfVar4 = pBVar20->gStateFrequencies[local_78[uVar16]];
      pfVar11 = pBVar20->gPartials[local_70];
      pfVar5 = pBVar20->gCategoryWeights[local_80[uVar16]];
      iVar15 = 0;
      iVar22 = (int)uVar12;
      if (0 < iVar22) {
        iVar18 = 0;
        iVar19 = 0;
        iVar3 = local_b8->kStateCount;
        pfVar6 = local_b8->integrationTmp;
        iVar15 = 0;
        do {
          if (0 < iVar3) {
            iVar21 = 0;
            lVar13 = 0;
            do {
              iVar21 = iVar21 + -1;
              *(float *)((long)pfVar6 + lVar13 + (long)iVar19 * 4) =
                   *(float *)((long)pfVar11 + lVar13 + (long)iVar15 * 4) * *pfVar5;
              lVar13 = lVar13 + 4;
            } while (-iVar3 != iVar21);
            iVar19 = iVar19 - iVar21;
            iVar15 = iVar15 - iVar21;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar22);
      }
      local_a0 = (long)local_b8->kCategoryCount;
      if (1 < local_a0) {
        iVar3 = local_b8->kStateCount;
        lVar13 = 1;
        do {
          if (0 < iVar22) {
            pfVar6 = local_b8->integrationTmp;
            iVar18 = 0;
            iVar19 = 0;
            do {
              if (0 < iVar3) {
                iVar21 = 0;
                lVar14 = 0;
                do {
                  iVar21 = iVar21 + -1;
                  auVar25 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[lVar13]),
                                            ZEXT416(*(uint *)((long)pfVar11 +
                                                             lVar14 + (long)iVar15 * 4)),
                                            ZEXT416(*(uint *)((long)pfVar6 +
                                                             lVar14 + (long)iVar19 * 4)));
                  *(int *)((long)pfVar6 + lVar14 + (long)iVar19 * 4) = auVar25._0_4_;
                  lVar14 = lVar14 + 4;
                } while (-iVar3 != iVar21);
                iVar19 = iVar19 - iVar21;
                iVar15 = iVar15 - iVar21;
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar22);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != local_a0);
      }
      pBVar20 = local_b8;
      local_b0 = uVar16;
      if (0 < iVar22) {
        lVar13 = 0;
        iVar22 = 0;
        do {
          iVar15 = pBVar20->kStateCount;
          if ((long)iVar15 < 1) {
            auVar28 = ZEXT864(0);
          }
          else {
            auVar28 = ZEXT864(0);
            lVar14 = 0;
            do {
              auVar25 = vfmadd231ss_fma(auVar28._0_16_,ZEXT416((uint)pfVar4[lVar14]),
                                        ZEXT416((uint)pBVar20->integrationTmp[iVar22 + lVar14]));
              auVar28 = ZEXT1664(auVar25);
              lVar14 = lVar14 + 1;
            } while (iVar15 != lVar14);
            iVar22 = iVar22 + iVar15;
          }
          fVar27 = auVar28._0_4_;
          uVar10 = (uint)pBVar20->kFlags;
          if (*local_a8 == -1) {
            if ((uVar10 >> 8 & 1) != 0) goto LAB_0013c17f;
          }
          else {
            if ((uVar10 >> 8 & 1) == 0) {
              iVar15 = local_a8[uVar16];
              bVar9 = true;
            }
            else {
LAB_0013c17f:
              iVar15 = (int)local_70 - pBVar20->kTipCount;
              bVar9 = false;
            }
            ppfVar7 = pBVar20->gScaleBuffers;
            pfVar11 = ppfVar7[iVar15];
            if (uVar16 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13] = 0;
              uVar17 = 0;
              fVar23 = pfVar11[lVar13];
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = fVar23;
              if ((int)local_98 != 1) {
                uVar16 = 1;
                uVar17 = 0;
                do {
                  if (bVar9) {
                    iVar15 = local_a8[uVar16];
                  }
                  else {
                    iVar15 = local_90[uVar16] - pBVar20->kTipCount;
                  }
                  fVar1 = ppfVar7[iVar15][lVar13];
                  if (fVar23 < fVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = (int)uVar16;
                    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = fVar1;
                    uVar17 = uVar16 & 0xffffffff;
                    fVar23 = fVar1;
                  }
                  uVar16 = uVar16 + 1;
                } while (local_88 != uVar16);
              }
            }
            else {
              uVar17 = (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar13];
            }
            uVar16 = local_b0;
            if (local_b0 != uVar17) {
              local_a0 = CONCAT44(local_a0._4_4_,fVar27);
              dVar24 = exp((double)(pfVar11[lVar13] -
                                   local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar13]));
              fVar27 = (float)(dVar24 * (double)(float)local_a0);
              uVar16 = local_b0;
              pBVar20 = local_b8;
            }
          }
          pfVar11 = pBVar20->outLogLikelihoodsTmp;
          if (uVar16 == 0) {
            pfVar11[lVar13] = fVar27;
          }
          else {
            fVar27 = fVar27 + pfVar11[lVar13];
            if (uVar16 == local_68) {
              dVar24 = log((double)fVar27);
              fVar27 = (float)dVar24;
              pfVar11 = local_b8->outLogLikelihoodsTmp;
              uVar16 = local_b0;
              pBVar20 = local_b8;
            }
            pfVar11[lVar13] = fVar27;
          }
          uVar12 = (ulong)pBVar20->kPatternCount;
          lVar13 = lVar13 + 1;
        } while (lVar13 < (long)uVar12);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != local_88);
  }
  if (*local_a8 == -1) {
    uVar10 = pBVar20->kPatternCount;
    if ((pBVar20->kFlags & 0x100) != 0) goto LAB_0013c2e3;
LAB_0013c312:
    *outSumLogLikelihood = 0.0;
    if (0 < (int)uVar10) {
      pdVar8 = pBVar20->gPatternWeights;
      pfVar4 = pBVar20->outLogLikelihoodsTmp;
      auVar25 = ZEXT816(0) << 0x40;
      uVar17 = 0;
      do {
        auVar26._0_8_ = (double)pfVar4[uVar17];
        auVar26._8_8_ = in_XMM3_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar8[uVar17];
        auVar25 = vfmadd231sd_fma(auVar25,auVar26,auVar2);
        uVar17 = uVar17 + 1;
        dVar24 = auVar25._0_8_;
        *outSumLogLikelihood = dVar24;
      } while (uVar10 != uVar17);
      iVar22 = (uint)(!NAN(dVar24) && !NAN(dVar24)) * 8 + -8;
      goto LAB_0013c362;
    }
  }
  else {
    uVar10 = pBVar20->kPatternCount;
LAB_0013c2e3:
    if (0 < (int)uVar10) {
      pfVar4 = pBVar20->outLogLikelihoodsTmp;
      uVar17 = 0;
      do {
        pfVar4[uVar17] =
             local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17] + pfVar4[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
      goto LAB_0013c312;
    }
    *outSumLogLikelihood = 0.0;
  }
  iVar22 = 0;
LAB_0013c362:
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar22;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}